

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

uint http2_conncheck(Curl_easy *data,connectdata *conn,uint checks_to_perform)

{
  Curl_recv *pCVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  _Bool _Var4;
  uint uVar5;
  int iVar6;
  _func__Bool_Curl_easy_ptr_connectdata_ptr_char_ptr_size_t_int_ptr *p_Var7;
  timediff_t tVar8;
  char *pcVar9;
  uint uVar10;
  curltime cVar11;
  curltime older;
  curltime newer;
  CURLcode local_34;
  
  uVar10 = 0;
  if ((checks_to_perform & 1) != 0) {
    if (((conn->bits).field_0x4 & 0x40) == 0) {
      uVar10 = 0;
      uVar5 = Curl_socket_check(conn->sock[0],-1,-1,0);
      if (uVar5 == 0) goto LAB_00597576;
      if ((uVar5 & 5) == 1) {
        _Var4 = Curl_connalive(conn);
        if ((_Var4) && (pCVar1 = (conn->proto).httpc.recv_underlying, pCVar1 != (Curl_recv *)0x0)) {
          uVar10 = 0;
          p_Var7 = (_func__Bool_Curl_easy_ptr_connectdata_ptr_char_ptr_size_t_int_ptr *)
                   (*pCVar1)(data,0,(char *)(conn->proto).ftpc.pp.statemachine,0x8000,&local_34);
          if (p_Var7 != (_func__Bool_Curl_easy_ptr_connectdata_ptr_char_ptr_size_t_int_ptr *)
                        0xffffffffffffffff) {
            (conn->proto).ftpc.entrypath = (char *)0x0;
            (conn->proto).ftpc.pp.endofresp = p_Var7;
            iVar6 = h2_process_pending_input(data,&(conn->proto).httpc,&local_34);
            if (-1 < iVar6) goto LAB_00597576;
          }
        }
      }
    }
    uVar10 = 1;
  }
LAB_00597576:
  if ((checks_to_perform & 2) != 0) {
    cVar11 = Curl_now();
    uVar2 = (conn->keepalive).tv_sec;
    uVar3 = (conn->keepalive).tv_usec;
    older.tv_usec = uVar3;
    older.tv_sec = uVar2;
    older._12_4_ = 0;
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar11._0_12_,0);
    newer.tv_usec = SUB124(cVar11._0_12_,8);
    tVar8 = Curl_timediff(newer,older);
    if ((data->set).upkeep_interval_ms < tVar8) {
      uVar5 = nghttp2_submit_ping((conn->proto).httpc.h2,'\0',(uint8_t *)0x0);
      if (uVar5 == 0) {
        (conn->keepalive).tv_sec = cVar11.tv_sec;
        (conn->keepalive).tv_usec = cVar11.tv_usec;
        (conn->proto).httpc.trnsfr = data;
        uVar5 = nghttp2_session_send((conn->proto).httpc.h2);
        if (uVar5 != 0) {
          pcVar9 = nghttp2_strerror(uVar5);
          Curl_failf(data,"nghttp2_session_send() failed: %s(%d)",pcVar9,(ulong)uVar5);
        }
      }
      else {
        pcVar9 = nghttp2_strerror(uVar5);
        Curl_failf(data,"nghttp2_submit_ping() failed: %s(%d)",pcVar9,(ulong)uVar5);
        (conn->keepalive).tv_sec = cVar11.tv_sec;
        (conn->keepalive).tv_usec = cVar11.tv_usec;
      }
    }
  }
  return uVar10;
}

Assistant:

static unsigned int http2_conncheck(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    unsigned int checks_to_perform)
{
  unsigned int ret_val = CONNRESULT_NONE;
  struct http_conn *c = &conn->proto.httpc;
  int rc;
  bool send_frames = false;

  if(checks_to_perform & CONNCHECK_ISDEAD) {
    if(http2_connisdead(data, conn))
      ret_val |= CONNRESULT_DEAD;
  }

  if(checks_to_perform & CONNCHECK_KEEPALIVE) {
    struct curltime now = Curl_now();
    timediff_t elapsed = Curl_timediff(now, conn->keepalive);

    if(elapsed > data->set.upkeep_interval_ms) {
      /* Perform an HTTP/2 PING */
      rc = nghttp2_submit_ping(c->h2, 0, ZERO_NULL);
      if(!rc) {
        /* Successfully added a PING frame to the session. Need to flag this
           so the frame is sent. */
        send_frames = true;
      }
      else {
       failf(data, "nghttp2_submit_ping() failed: %s(%d)",
             nghttp2_strerror(rc), rc);
      }

      conn->keepalive = now;
    }
  }

  if(send_frames) {
    set_transfer(c, data); /* set the transfer */
    rc = nghttp2_session_send(c->h2);
    if(rc)
      failf(data, "nghttp2_session_send() failed: %s(%d)",
            nghttp2_strerror(rc), rc);
  }

  return ret_val;
}